

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::SnakeCaseCamelCaseTest_RoundTripTest_Test::
~SnakeCaseCamelCaseTest_RoundTripTest_Test(SnakeCaseCamelCaseTest_RoundTripTest_Test *this)

{
  SnakeCaseCamelCaseTest_RoundTripTest_Test *this_local;
  
  ~SnakeCaseCamelCaseTest_RoundTripTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(SnakeCaseCamelCaseTest, RoundTripTest) {
  // Enumerates all possible snake_case names and test that converting it to
  // camelCase and then to snake_case again will yield the original name.
  std::string name = "___abc123";
  std::sort(name.begin(), name.end());
  do {
    std::string camelName = SnakeCaseToCamelCase(name);
    if (camelName != "#FAIL#") {
      EXPECT_EQ(name, CamelCaseToSnakeCase(camelName));
    }
  } while (std::next_permutation(name.begin(), name.end()));

  // Enumerates all possible camelCase names and test that converting it to
  // snake_case and then to camelCase again will yield the original name.
  name = "abcABC123";
  std::sort(name.begin(), name.end());
  do {
    std::string camelName = CamelCaseToSnakeCase(name);
    if (camelName != "#FAIL#") {
      EXPECT_EQ(name, SnakeCaseToCamelCase(camelName));
    }
  } while (std::next_permutation(name.begin(), name.end()));
}